

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall
r_exec::NotificationView::NotificationView
          (NotificationView *this,Code *origin,Code *destination,Code *marker)

{
  Atom *pAVar1;
  _Mem *this_00;
  uint64_t uVar2;
  float local_9c;
  Atom local_60 [4];
  Atom local_5c [4];
  Atom local_58 [4];
  Atom local_54 [4];
  Atom local_50 [4];
  Atom local_4c [4];
  Atom local_48 [4];
  Atom local_44 [4];
  Atom local_40 [20];
  Atom local_2c [4];
  Code *local_28;
  Code *marker_local;
  Code *destination_local;
  Code *origin_local;
  NotificationView *this_local;
  
  local_28 = marker;
  marker_local = destination;
  destination_local = origin;
  origin_local = (Code *)this;
  View::View(&this->super_View);
  (this->super_View).super_View.super__Object._vptr__Object =
       (_func_int **)&PTR__NotificationView_002ed620;
  r_code::Atom::SSet((ushort)local_2c,(uchar)View::ViewOpcode);
  pAVar1 = r_code::View::code((View *)this,0);
  r_code::Atom::operator=(pAVar1,local_2c);
  r_code::Atom::~Atom(local_2c);
  r_code::Atom::Float(0.0);
  pAVar1 = r_code::View::code((View *)this,1);
  r_code::Atom::operator=(pAVar1,local_40);
  r_code::Atom::~Atom(local_40);
  r_code::Atom::IPointer((ushort)local_44);
  pAVar1 = r_code::View::code((View *)this,2);
  r_code::Atom::operator=(pAVar1,local_44);
  r_code::Atom::~Atom(local_44);
  r_code::Atom::Float(1.0);
  pAVar1 = r_code::View::code((View *)this,3);
  r_code::Atom::operator=(pAVar1,local_48);
  r_code::Atom::~Atom(local_48);
  this_00 = _Mem::Get();
  uVar2 = _Mem::get_ntf_mk_res(this_00);
  local_9c = (float)uVar2;
  r_code::Atom::Float(local_9c);
  pAVar1 = r_code::View::code((View *)this,4);
  r_code::Atom::operator=(pAVar1,local_4c);
  r_code::Atom::~Atom(local_4c);
  r_code::Atom::RPointer((ushort)local_50);
  pAVar1 = r_code::View::code((View *)this,5);
  r_code::Atom::operator=(pAVar1,local_50);
  r_code::Atom::~Atom(local_50);
  r_code::Atom::RPointer((ushort)local_54);
  pAVar1 = r_code::View::code((View *)this,6);
  r_code::Atom::operator=(pAVar1,local_54);
  r_code::Atom::~Atom(local_54);
  r_code::Atom::Timestamp();
  pAVar1 = r_code::View::code((View *)this,7);
  r_code::Atom::operator=(pAVar1,local_58);
  r_code::Atom::~Atom(local_58);
  r_code::Atom::Atom(local_5c,0);
  pAVar1 = r_code::View::code((View *)this,8);
  r_code::Atom::operator=(pAVar1,local_5c);
  r_code::Atom::~Atom(local_5c);
  r_code::Atom::Atom(local_60,0);
  pAVar1 = r_code::View::code((View *)this,9);
  r_code::Atom::operator=(pAVar1,local_60);
  r_code::Atom::~Atom(local_60);
  (this->super_View).super_View.references[0] = marker_local;
  (this->super_View).super_View.references[1] = destination_local;
  View::reset_init_sln(&this->super_View);
  core::P<r_code::Code>::operator=(&(this->super_View).super_View.object,local_28);
  return;
}

Assistant:

NotificationView::NotificationView(Code *origin, Code *destination, Code *marker): View()
{
    code(VIEW_OPCODE) = r_code::Atom::SSet(ViewOpcode, VIEW_ARITY); // Structured Set.
    code(VIEW_SYNC) = r_code::Atom::Float(View::SYNC_ONCE); // sync once.
    code(VIEW_IJT) = r_code::Atom::IPointer(VIEW_ARITY + 1); // iptr to ijt.
    code(VIEW_SLN) = r_code::Atom::Float(1); // sln.
    code(VIEW_RES) = r_code::Atom::Float(_Mem::Get()->get_ntf_mk_res()); // res.
    code(VIEW_HOST) = r_code::Atom::RPointer(0); // destination.
    code(VIEW_ORG) = r_code::Atom::RPointer(1); // origin.
    code(VIEW_ARITY + 1) = r_code::Atom::Timestamp(); // ijt will be set at injection time.
    code(VIEW_ARITY + 2) = 0;
    code(VIEW_ARITY + 3) = 0;
    references[0] = destination;
    references[1] = origin;
    reset_init_sln();
    object = marker;
}